

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall helics::CommonCore::waitCoreRegistration(CommonCore *this)

{
  format_args args;
  string_view fmt;
  string_view message;
  string_view message_00;
  string_view message_01;
  bool bVar1;
  BrokerState BVar2;
  BaseType BVar3;
  size_t in_RCX;
  sockaddr *__addr;
  GlobalFederateId __fd;
  CommonCore *in_RDI;
  ActionMessage resend;
  GlobalBrokerId brkid;
  int sleepcnt;
  ActionMessage *message_02;
  BrokerBase *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd50;
  ActionMessage *in_stack_fffffffffffffd60;
  byte local_281;
  TimeRepresentation<count_time<9,_long>_> local_278;
  BaseType local_270;
  int local_26c;
  duration<long,std::ratio<1l,1000l>> local_268 [8];
  undefined1 local_260 [4];
  undefined4 local_25c;
  ActionMessage *local_1a8;
  BrokerBase *pBStack_1a0;
  __sv_type local_198;
  undefined4 local_188;
  GlobalFederateId local_184 [3];
  BrokerBase *local_178;
  size_t local_170;
  bool fromRemote;
  int logLevel;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  string_view in_stack_fffffffffffffea8;
  BaseType local_148;
  GlobalFederateId in_stack_fffffffffffffebc;
  undefined1 local_130 [32];
  __sv_type local_110;
  __sv_type local_100;
  undefined4 local_ec;
  GlobalFederateId local_e8;
  undefined4 local_e4;
  GlobalBrokerId local_e0;
  int local_dc [5];
  int local_c8 [4];
  BaseType local_b8;
  int local_a8;
  undefined8 local_98;
  int *local_90;
  char *local_88;
  undefined8 uStack_80;
  int *local_70;
  BaseType *local_68;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int *in_stack_ffffffffffffffe8;
  
  local_dc[0] = 0;
  local_e0 = CLI::std::atomic<helics::GlobalBrokerId>::load
                       (&(in_RDI->super_BrokerBase).global_id,seq_cst);
  while( true ) {
    local_e4 = 0;
    __fd.gid = 0;
    bVar1 = GlobalBrokerId::operator==(&local_e0,(GlobalBrokerId)0x0);
    in_RCX = CONCAT71((int7)(in_RCX >> 8),bVar1);
    local_281 = 1;
    if (!bVar1) {
      bVar1 = GlobalBrokerId::isValid(&local_e0);
      local_281 = bVar1 ^ 0xff;
    }
    if ((local_281 & 1) == 0) {
      return true;
    }
    if (6 < local_dc[0]) {
      local_ec = 0;
      GlobalFederateId::GlobalFederateId(&local_e8,(GlobalBrokerId)0x0);
      local_100 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd40);
      BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x46558c);
      in_stack_fffffffffffffebc.gid = (BaseType)BVar2;
      BVar3 = GlobalBrokerId::baseValue(&local_e0);
      local_68 = &local_148;
      local_70 = local_dc;
      local_88 = "broker state={}, broker id={}, sleepcnt={}";
      uStack_80 = 0x2a;
      in_stack_ffffffffffffffe8 = local_c8;
      local_b8 = local_148;
      local_a8 = local_dc[0];
      local_98 = 0x111;
      fmt.size_ = (size_t)local_130;
      fmt.data_ = (char *)0x2a;
      args.field_1.values_ =
           (value<fmt::v11::context> *)"broker state={}, broker id={}, sleepcnt={}";
      args.desc_ = (unsigned_long_long)&stack0xfffffffffffffebc;
      local_148 = BVar3;
      in_stack_ffffffffffffffe4 = in_stack_fffffffffffffebc.gid;
      local_c8[0] = in_stack_fffffffffffffebc.gid;
      local_90 = in_stack_ffffffffffffffe8;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      local_110 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd40);
      message._M_len._4_4_ = in_stack_ffffffffffffffe4;
      message._M_len._0_4_ = in_stack_ffffffffffffffe0;
      message._M_str = (char *)in_stack_ffffffffffffffe8;
      in_RCX = local_100._M_len;
      __fd.gid = local_e8.gid;
      in_stack_fffffffffffffd40 = (BrokerBase *)local_110._M_str;
      BrokerBase::sendToLogger
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffebc,logLevel,in_stack_fffffffffffffea8,message,fromRemote);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd40);
    }
    BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x4657a1);
    if (BVar2 < ~TERMINATING) {
      connect(in_RDI,__fd.gid,__addr,(socklen_t)in_RCX);
    }
    BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x4657bf);
    if (CONNECTED_ERROR < BVar2) break;
    if (local_dc[0] == 4) {
      in_stack_fffffffffffffd60 = (ActionMessage *)&in_RDI->super_BrokerBase;
      in_stack_fffffffffffffea4 = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffea8,(GlobalBrokerId)0x0);
      _local_170 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd40);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      message_00._M_len._4_4_ = in_stack_ffffffffffffffe4;
      message_00._M_len._0_4_ = in_stack_ffffffffffffffe0;
      message_00._M_str = (char *)in_stack_ffffffffffffffe8;
      in_RCX = local_170;
      in_stack_fffffffffffffd40 = local_178;
      BrokerBase::sendToLogger
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffebc,logLevel,in_stack_fffffffffffffea8,message_00,fromRemote)
      ;
    }
    if (local_dc[0] == 0x14) {
      in_stack_fffffffffffffd50 =
           (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->super_BrokerBase;
      local_188 = 0;
      GlobalFederateId::GlobalFederateId(local_184,(GlobalBrokerId)0x0);
      local_198 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd40);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      message_01._M_len._4_4_ = in_stack_ffffffffffffffe4;
      message_01._M_len._0_4_ = in_stack_ffffffffffffffe0;
      message_01._M_str = (char *)in_stack_ffffffffffffffe8;
      in_RCX = local_198._M_len;
      message_02 = local_1a8;
      in_stack_fffffffffffffd40 = pBStack_1a0;
      BrokerBase::sendToLogger
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffebc,logLevel,in_stack_fffffffffffffea8,message_01,fromRemote)
      ;
      ActionMessage::ActionMessage(in_stack_fffffffffffffd60,(action_t)((ulong)local_260 >> 0x20));
      local_25c = 0xefffffd8;
      BrokerBase::addActionMessage(in_stack_fffffffffffffd40,message_02);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffd40);
    }
    local_26c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_268,&local_26c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_RDI);
    local_270 = (BaseType)
                CLI::std::atomic<helics::GlobalBrokerId>::load
                          (&(in_RDI->super_BrokerBase).global_id,seq_cst);
    local_dc[0] = local_dc[0] + 1;
    local_e0 = (GlobalBrokerId)local_270;
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd50,
               (int64_t)in_stack_fffffffffffffd48,
               (time_units)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&local_278,&(in_RDI->super_BrokerBase).timeout);
    if (bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

bool CommonCore::waitCoreRegistration()
{
    int sleepcnt = 0;
    auto brkid = global_id.load();
    while ((brkid == parent_broker_id) || (!brkid.isValid())) {
        if (sleepcnt > 6) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        fmt::format("broker state={}, broker id={}, sleepcnt={}",
                                    static_cast<int>(getBrokerState()),
                                    brkid.baseValue(),
                                    sleepcnt));
        }
        if (getBrokerState() <= BrokerState::CONFIGURED) {
            connect();
        }
        if (getBrokerState() >= BrokerState::TERMINATING) {
            return false;
        }
        if (sleepcnt == 4) {
            LOG_WARNING(parent_broker_id,
                        identifier,
                        "now waiting for the core to finish registration before proceeding");
        }
        if (sleepcnt == 20) {
            LOG_WARNING(parent_broker_id, identifier, "resending reg message");
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        brkid = global_id.load();
        ++sleepcnt;
        if (Time(static_cast<int64_t>(sleepcnt) * 100, time_units::ms) > timeout) {
            return false;
        }
    }
    return true;
}